

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lottiekeypath.cpp
# Opt level: O1

bool __thiscall LOTKeyPath::matches(LOTKeyPath *this,string *key,uint32_t depth)

{
  pointer pbVar1;
  size_t __n;
  int iVar2;
  ulong uVar3;
  bool bVar4;
  
  iVar2 = std::__cxx11::string::compare((char *)key);
  bVar4 = true;
  if (iVar2 != 0) {
    uVar3 = (ulong)depth;
    pbVar1 = (this->mKeys).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (((long)(this->mKeys).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5) - 1U < uVar3) {
      bVar4 = false;
    }
    else {
      __n = pbVar1[uVar3]._M_string_length;
      if (__n == key->_M_string_length) {
        if (__n == 0) {
          return true;
        }
        iVar2 = bcmp(pbVar1[uVar3]._M_dataplus._M_p,(key->_M_dataplus)._M_p,__n);
        if (iVar2 == 0) {
          return true;
        }
      }
      iVar2 = std::__cxx11::string::compare((char *)(pbVar1 + uVar3));
      if (iVar2 != 0) {
        iVar2 = std::__cxx11::string::compare
                          ((char *)((this->mKeys).
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start + uVar3));
        bVar4 = iVar2 == 0;
      }
    }
  }
  return bVar4;
}

Assistant:

bool LOTKeyPath::matches(const std::string &key, uint32_t depth)
{
    if (skip(key)) {
        // This is an object we programatically create.
        return true;
    }
    if (depth > size()) {
        return false;
    }
    if ((mKeys[depth] == key) || (mKeys[depth] == "*") ||
        (mKeys[depth] == "**")) {
        return true;
    }
    return false;
}